

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Node * __thiscall
google::protobuf::Map<int,_google::protobuf::UInt64Value>::CloneFromOther
          (Map<int,_google::protobuf::UInt64Value> *this,
          Map<int,_google::protobuf::UInt64Value> *other)

{
  UInt64Value *this_00;
  Node *pNVar1;
  NodeBase *pNVar2;
  uint uVar3;
  ulong uVar4;
  Node *pNVar5;
  
  uVar3 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar4 = (ulong)uVar3;
  if (uVar3 == (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    return (Node *)0x0;
  }
  pNVar2 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar4];
  if (pNVar2 != (NodeBase *)0x0) {
    pNVar5 = (Node *)0x0;
    do {
      do {
        pNVar1 = (Node *)protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
        (pNVar1->kv).first = *(int *)&pNVar2[1].next;
        this_00 = &(pNVar1->kv).second;
        UInt64Value::UInt64Value
                  (this_00,(this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.arena_);
        UInt64Value::CopyFrom(this_00,(UInt64Value *)(pNVar2 + 2));
        (pNVar1->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar5;
        pNVar2 = pNVar2->next;
        pNVar5 = pNVar1;
      } while (pNVar2 != (NodeBase *)0x0);
      do {
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        if ((other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar3) {
          return pNVar1;
        }
        pNVar2 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar3];
      } while (pNVar2 == (NodeBase *)0x0);
    } while( true );
  }
  protobuf::internal::protobuf_assumption_failed
            ("node != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x22e);
}

Assistant:

inline UntypedMapIterator UntypedMapBase::begin() const {
  map_index_t bucket_index;
  NodeBase* node;
  if (index_of_first_non_null_ == num_buckets_) {
    bucket_index = 0;
    node = nullptr;
  } else {
    bucket_index = index_of_first_non_null_;
    node = table_[bucket_index];
    PROTOBUF_ASSUME(node != nullptr);
  }
  return UntypedMapIterator{node, this, bucket_index};
}